

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O0

AST * parse_finish_goto_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  token *label;
  AST_Goto_Statement *error;
  AST *ret;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  cVar1 = check(translation_data,KW_ID,0);
  if (cVar1 == '\0') {
    push_translation_error(" label expected in goto statement",translation_data);
    error = get_goto_statement_tree((token *)0x0,(Scope *)0x0);
    translation_data_local = (Translation_Data *)get_error_tree((AST *)error);
  }
  else {
    label = (token *)Queue_Pop(translation_data->tokens);
    translation_data_local = (Translation_Data *)get_goto_statement_tree(label,scope);
    cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
    if (cVar1 == '\0') {
      push_translation_error(" \';\' expected",translation_data);
      translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
    }
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_finish_goto_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST* ret;

	if(check(translation_data,KW_ID,0))
	{
		ret=(struct AST*)get_goto_statement_tree(Queue_Pop(translation_data->tokens),scope);
		if(get_and_check(translation_data,KW_SEMI_COLUMN))
		{
			return ret;
		}else
		{
			push_translation_error(" ';' expected",translation_data);
			return (struct AST*)get_error_tree(ret);
		}
	}
	else
	{
		push_translation_error(" label expected in goto statement",translation_data);
		return (struct AST*)get_error_tree((struct AST*)get_goto_statement_tree(NULL,NULL));
	}

}